

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O1

void test_psbt_read(psbt_test *test,uchar *p,size_t plen)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *str;
  long lVar4;
  ulong bufsize;
  uchar *bytes;
  byte bVar5;
  bool bVar6;
  wally_psbt *psbt;
  wally_psbt *local_40;
  psbt_test *local_38;
  
  sVar3 = strlen(test->hex);
  if (plen < sVar3 >> 1) {
    __assert_fail("hex_data_size(strlen(test->hex)) <= plen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/libwally-core/src/ctest/test_psbt_limits.c"
                  ,0x50,"void test_psbt_read(const struct psbt_test *, unsigned char *, size_t)");
  }
  str = test->hex;
  bufsize = 0;
  local_38 = test;
  do {
    bytes = p + (plen - bufsize);
    _Var1 = hex_decode(str,bufsize * 2,bytes,bufsize);
    if (!_Var1) {
      abort();
    }
    iVar2 = wally_psbt_from_bytes(bytes,bufsize,&local_40);
    if (iVar2 == 0) {
      wally_psbt_free(local_40);
    }
    lVar4 = 0;
    do {
      bVar5 = (byte)(1 << ((byte)lVar4 & 0x1f));
      p[plen - 1] = p[plen - 1] ^ bVar5;
      iVar2 = wally_psbt_from_bytes(bytes,bufsize,&local_40);
      if (iVar2 == 0) {
        wally_psbt_free(local_40);
      }
      p[plen - 1] = p[plen - 1] ^ bVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    str = local_38->hex;
    sVar3 = strlen(str);
    bVar6 = bufsize < sVar3 >> 1;
    bufsize = bufsize + 1;
  } while (bVar6);
  return;
}

Assistant:

static void test_psbt_read(const struct psbt_test *test,
                           unsigned char *p, size_t plen)
{
    size_t i;

    /* It can fit, otherwise adjust cliff() */
    assert(hex_data_size(strlen(test->hex)) <= plen);

    /* Unpack right next to the cliff */
    for (i = 0; i <= hex_data_size(strlen(test->hex)); i++) {
        struct wally_psbt *psbt;
        size_t bit;

        if (!hex_decode(test->hex, i * 2, p + plen - i, i))
            abort();

        /* Try it raw: probably will fail. */
        if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
            wally_psbt_free(psbt);

        /* Now try flipping each bit in last byte. */
        for (bit = 0; bit < 8; bit++) {
            p[plen - 1] ^= (1 << bit);
            if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
                wally_psbt_free(psbt);
            p[plen - 1] ^= (1 << bit);
        }
    }
}